

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zip.cc
# Opt level: O0

ssize_t __thiscall Zip::read(Zip *this,int __fd,void *__buf,size_t __nbytes)

{
  pointer pbVar1;
  char *pcVar2;
  runtime_error *prVar3;
  size_type sVar4;
  undefined4 in_register_00000034;
  char (*pacVar5) [85];
  z_stream z;
  int rv;
  vector<char,_std::allocator<char>_> in;
  vector<char,_std::allocator<char>_> *out;
  vector<char,_std::allocator<char>_> *in_stack_fffffffffffffe60;
  size_type in_stack_fffffffffffffe68;
  undefined4 in_stack_fffffffffffffe70;
  undefined4 in_stack_fffffffffffffe74;
  string local_128 [35];
  undefined1 local_105;
  undefined4 local_104;
  string local_100 [35];
  undefined1 local_dd;
  undefined4 local_dc;
  string local_d8 [32];
  char *local_b8;
  undefined4 local_b0;
  char *local_a0;
  int local_98;
  undefined8 local_78;
  undefined8 local_70;
  undefined8 local_68;
  int local_44;
  vector<char,_std::allocator<char>_> local_40;
  undefined4 local_28;
  int *in_stack_ffffffffffffffe0;
  undefined7 in_stack_ffffffffffffffe8;
  undefined1 uVar6;
  byte bVar7;
  char (*args_1) [85];
  Zip *args;
  
  pacVar5 = (char (*) [85])CONCAT44(in_register_00000034,__fd);
  uVar6 = 0;
  args_1 = pacVar5;
  args = this;
  std::vector<char,_std::allocator<char>_>::vector((vector<char,_std::allocator<char>_> *)0x1069d1);
  std::vector<char,_std::allocator<char>_>::resize
            ((vector<char,_std::allocator<char>_> *)
             CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70),in_stack_fffffffffffffe68
            );
  if (*(short *)(*pacVar5 + 0x28) == 0) {
    pbVar1 = std::
             unique_ptr<std::basic_istream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_istream<char,_std::char_traits<char>_>_>_>
             ::operator->((unique_ptr<std::basic_istream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_istream<char,_std::char_traits<char>_>_>_>
                           *)0x106a02);
    pcVar2 = std::vector<char,_std::allocator<char>_>::data
                       ((vector<char,_std::allocator<char>_> *)0x106a14);
    std::vector<char,_std::allocator<char>_>::size((vector<char,_std::allocator<char>_> *)this);
    std::istream::read((char *)pbVar1,(long)pcVar2);
    bVar7 = 1;
    local_28 = 1;
  }
  else {
    if (*(short *)(*pacVar5 + 0x28) != 8) {
      prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(prVar3,"Unknown compression method");
      __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    std::vector<char,_std::allocator<char>_>::vector
              ((vector<char,_std::allocator<char>_> *)0x106a8f);
    std::vector<char,_std::allocator<char>_>::resize
              ((vector<char,_std::allocator<char>_> *)
               CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70),
               in_stack_fffffffffffffe68);
    pbVar1 = std::
             unique_ptr<std::basic_istream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_istream<char,_std::char_traits<char>_>_>_>
             ::operator->((unique_ptr<std::basic_istream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_istream<char,_std::char_traits<char>_>_>_>
                           *)0x106aaf);
    pcVar2 = std::vector<char,_std::allocator<char>_>::data
                       ((vector<char,_std::allocator<char>_> *)0x106ac6);
    std::vector<char,_std::allocator<char>_>::size(&local_40);
    std::istream::read((char *)pbVar1,(long)pcVar2);
    local_78 = 0;
    local_70 = 0;
    local_68 = 0;
    local_44 = inflateInit2_(&local_b8,0xfffffff1,"1.2.11",0x70);
    if (local_44 != 0) {
      local_dd = 1;
      prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
      local_dc = 0x72;
      util::str<char[34],char[85],char[2],int>
                ((char (*) [34])args,args_1,(char (*) [2])CONCAT17(uVar6,in_stack_ffffffffffffffe8),
                 in_stack_ffffffffffffffe0);
      std::runtime_error::runtime_error(prVar3,local_d8);
      local_dd = 0;
      __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    sVar4 = std::vector<char,_std::allocator<char>_>::size(&local_40);
    local_b0 = (undefined4)sVar4;
    local_b8 = std::vector<char,_std::allocator<char>_>::data
                         ((vector<char,_std::allocator<char>_> *)0x106c63);
    sVar4 = std::vector<char,_std::allocator<char>_>::size
                      ((vector<char,_std::allocator<char>_> *)this);
    local_98 = (int)sVar4;
    local_a0 = std::vector<char,_std::allocator<char>_>::data
                         ((vector<char,_std::allocator<char>_> *)0x106c8c);
    local_44 = inflate(&local_b8,4);
    if (local_44 != 1) {
      local_105 = 1;
      prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
      local_104 = 0x7a;
      util::str<char[42],char[85],char[2],int>
                ((char (*) [42])args,args_1,(char (*) [2])CONCAT17(uVar6,in_stack_ffffffffffffffe8),
                 in_stack_ffffffffffffffe0);
      std::runtime_error::runtime_error(prVar3,local_100);
      local_105 = 0;
      __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    if (local_98 != 0) {
      prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
      util::str<char[40],char[85],char[2],int>
                ((char (*) [40])args,args_1,(char (*) [2])CONCAT17(uVar6,in_stack_ffffffffffffffe8),
                 in_stack_ffffffffffffffe0);
      std::runtime_error::runtime_error(prVar3,local_128);
      __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    inflateEnd(&local_b8);
    bVar7 = 1;
    local_28 = 1;
    std::vector<char,_std::allocator<char>_>::~vector(in_stack_fffffffffffffe60);
  }
  if ((bVar7 & 1) == 0) {
    std::vector<char,_std::allocator<char>_>::~vector(in_stack_fffffffffffffe60);
  }
  return (ssize_t)this;
}

Assistant:

std::vector<char> Zip::read() const {
  std::vector<char> out;

  // Decompress in memory
  out.resize(cdfh_.uncompressedSize);

  // Store
  if (cdfh_.compressionMethod == 0) {
    is_->read(out.data(), out.size());
    return out;
  }

  // Deflate
  if (cdfh_.compressionMethod == 8) {
    std::vector<char> in;
    int rv;

    // Read uncompressed data
    in.resize(cdfh_.compressedSize);
    is_->read(in.data(), in.size());

    // Initialize zlib
    z_stream z;
    z.zalloc = nullptr;
    z.zfree = nullptr;
    z.opaque = nullptr;

    // Use negative window bits to indicate raw data
    rv = inflateInit2(&z, -MAX_WBITS);
    ASSERT(rv == Z_OK);

    // Inflate entire file
    z.avail_in = in.size();
    z.next_in = (unsigned char*) in.data();
    z.avail_out = out.size();
    z.next_out = (unsigned char*) out.data();
    rv = inflate(&z, Z_FINISH);
    ASSERT(rv == Z_STREAM_END);
    ASSERT(z.avail_out == 0);

    // Finalize
    inflateEnd(&z);
    return out;
  }

  throw std::runtime_error("Unknown compression method");
}